

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
          (polymorphic_allocator<std::byte> *this,NanoVDBMediumProvider *p,Bounds3<float> *args,
          GridHandle<pbrt::NanoVDBBuffer> *args_1,GridHandle<pbrt::NanoVDBBuffer> *args_2,
          float *args_3,float *args_4,float *args_5)

{
  GridHandle<pbrt::NanoVDBBuffer> local_70;
  GridHandle<pbrt::NanoVDBBuffer> local_50;
  
  local_50.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)&PTR__GridHandle_0309da98;
  local_50.mBuffer.alloc.memoryResource = new_delete_resource();
  local_50.mBuffer.bytesAllocated = 0;
  local_50.mBuffer.ptr = (uint8_t *)0x0;
  pbrt::NanoVDBBuffer::operator=(&local_50.mBuffer,&args_1->mBuffer);
  local_70.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)&PTR__GridHandle_0309da98;
  local_70.mBuffer.alloc.memoryResource = new_delete_resource();
  local_70.mBuffer.bytesAllocated = 0;
  local_70.mBuffer.ptr = (uint8_t *)0x0;
  pbrt::NanoVDBBuffer::operator=(&local_70.mBuffer,&args_2->mBuffer);
  pbrt::NanoVDBMediumProvider::NanoVDBMediumProvider
            (p,args,&local_50,&local_70,*args_3,*args_4,*args_5);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&local_70);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&local_50);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }